

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::transcode_uastc_to_bc1_hint1
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst,
               bool high_quality)

{
  uint uVar1;
  uint uVar2;
  int i;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = unpacked_src_blk->m_mode;
  *(undefined4 *)pDst = 1;
  uVar4 = 0;
  iVar3 = 0xf;
  do {
    uVar2 = uVar4 << 2;
    uVar4 = *(byte *)(*(long *)(s_uastc_to_bc1_weights +
                               (ulong)(byte)g_uastc_mode_weight_bits[uVar1] * 8) +
                     (ulong)(unpacked_src_blk->m_astc).m_weights
                            [iVar3 << (g_uastc_mode_planes[uVar1] - 1 & 0x1f)]) | uVar2;
    bVar5 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar5);
  *(char *)((long)pDst + 4) = (char)uVar4;
  *(char *)((long)pDst + 5) = (char)(uVar2 >> 8);
  *(char *)((long)pDst + 6) = (char)(uVar2 >> 0x10);
  *(char *)((long)pDst + 7) = (char)(uVar2 >> 0x18);
  encode_bc1(pDst,(uint8_t *)block_pixels,high_quality | 4);
  return;
}

Assistant:

void transcode_uastc_to_bc1_hint1(const unpacked_uastc_block& unpacked_src_blk, const color32 block_pixels[4][4], void* pDst, bool high_quality)
	{
		const uint32_t mode = unpacked_src_blk.m_mode;

		const astc_block_desc& astc_blk = unpacked_src_blk.m_astc;

		dxt1_block& b = *static_cast<dxt1_block*>(pDst);

		b.set_low_color(1);
		b.set_high_color(0);

		const uint8_t* pTran = s_uastc_to_bc1_weights[g_uastc_mode_weight_bits[mode]];

		const uint32_t plane_shift = g_uastc_mode_planes[mode] - 1;

		uint32_t sels = 0;
		for (int i = 15; i >= 0; --i)
		{
			sels <<= 2;
			sels |= pTran[astc_blk.m_weights[i << plane_shift]];
		}

		b.m_selectors[0] = sels & 0xFF;
		b.m_selectors[1] = (sels >> 8) & 0xFF;
		b.m_selectors[2] = (sels >> 16) & 0xFF;
		b.m_selectors[3] = (sels >> 24) & 0xFF;

		encode_bc1(&b, (const uint8_t*)&block_pixels[0][0].c[0], (high_quality ? cEncodeBC1HighQuality : 0) | cEncodeBC1UseSelectors);
	}